

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O2

bool __thiscall
dlib::
matrix_multiply_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>
::aliases<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>
          (matrix_multiply_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>,_dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>
           *this,matrix_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_> *item)

{
  if (*(float **)item != (((this->lhs->op).m)->op).ptr) {
    return *(float **)item == (((this->rhs->op).m)->op).ptr;
  }
  return true;
}

Assistant:

bool aliases (
            const matrix_exp<U>& item
        ) const { return lhs.aliases(item) || rhs.aliases(item); }